

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::DoubleAPFloat::getExactInverse(DoubleAPFloat *this,APFloat *inv)

{
  bool bVar1;
  APFloat Inv;
  APFloat Tmp;
  anon_union_8_2_1313ab2f_for_U local_a0;
  uint local_98;
  APFloat local_90;
  APFloat local_70;
  Storage local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)&local_90);
    IEEEFloat::IEEEFloat
              (&local_70.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_90);
    if ((0x40 < (uint)local_90.U._0_4_) && ((fltSemantics *)local_90._0_8_ != (fltSemantics *)0x0))
    {
      operator_delete__((void *)local_90._0_8_);
    }
    if (inv == (APFloat *)0x0) {
      bVar1 = APFloat::getExactInverse(&local_70,(APFloat *)0x0);
    }
    else {
      IEEEFloat::IEEEFloat(&local_90.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy);
      bVar1 = APFloat::getExactInverse(&local_70,&local_90);
      APFloat::bitcastToAPInt((APFloat *)&local_a0);
      DoubleAPFloat((DoubleAPFloat *)&local_48.IEEE,(fltSemantics *)semPPCDoubleDouble,
                    (APInt *)&local_a0);
      APFloat::Storage::operator=((Storage *)&(inv->U).IEEE,&local_48);
      APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
      if ((0x40 < local_98) && ((void *)local_a0.VAL != (void *)0x0)) {
        operator_delete__(local_a0.pVal);
      }
      APFloat::Storage::~Storage((Storage *)&local_90.U.IEEE);
    }
    APFloat::Storage::~Storage((Storage *)&local_70.U.IEEE);
    return bVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1123,"bool llvm::detail::DoubleAPFloat::getExactInverse(APFloat *) const");
}

Assistant:

bool DoubleAPFloat::getExactInverse(APFloat *inv) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  if (!inv)
    return Tmp.getExactInverse(nullptr);
  APFloat Inv(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.getExactInverse(&Inv);
  *inv = APFloat(semPPCDoubleDouble, Inv.bitcastToAPInt());
  return Ret;
}